

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9918.cpp
# Opt level: O2

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)3>::commit_register
          (Base<(TI::TMS::Personality)3> *this,int reg,uint8_t value)

{
  bool bVar1;
  uint8_t uVar2;
  
  if ((reg & 0x40U) == 0) {
    switch(reg & 0xf) {
    case 0:
      this->mode2_enable_ = (bool)(value >> 1 & 1);
      (this->super_Storage<(TI::TMS::Personality)3,_void>).vertical_scroll_lock_ =
           (bool)(value >> 7);
      (this->super_Storage<(TI::TMS::Personality)3,_void>).horizontal_scroll_lock_ =
           (bool)(value >> 6 & 1);
      (this->super_Storage<(TI::TMS::Personality)3,_void>).hide_left_column_ =
           (bool)(value >> 5 & 1);
      this->enable_line_interrupts_ = (bool)(value >> 4 & 1);
      (this->super_Storage<(TI::TMS::Personality)3,_void>).shift_sprites_8px_left_ =
           (bool)(value >> 3 & 1);
      (this->super_Storage<(TI::TMS::Personality)3,_void>).mode4_enable_ = (bool)(value >> 2 & 1);
      break;
    case 1:
      this->blank_display_ = (value & 0x40) == 0;
      this->generate_interrupts_ = (bool)(value >> 5 & 1);
      this->mode1_enable_ = (bool)(value >> 4 & 1);
      this->mode3_enable_ = (bool)(value >> 3 & 1);
      bVar1 = (bool)(value >> 1 & 1);
      this->sprites_16x16_ = bVar1;
      uVar2 = bVar1 * '\b' + '\b';
      this->sprites_magnified_ = (bool)(value & 1);
      this->sprite_height_ = uVar2;
      if ((bool)(value & 1) != false) {
        this->sprite_height_ = uVar2 * '\x02';
      }
      break;
    case 2:
      install_field<10,8>(this,&this->pattern_name_address_,value);
      (this->super_Storage<(TI::TMS::Personality)3,_void>).pattern_name_address_ =
           this->pattern_name_address_;
      break;
    case 3:
      install_field<6,8>(this,&this->colour_table_address_,value);
      return;
    case 4:
      install_field<11,8>(this,&this->pattern_generator_table_address_,value);
      return;
    case 5:
      install_field<7,8>(this,&this->sprite_attribute_table_address_,value);
      (this->super_Storage<(TI::TMS::Personality)3,_void>).sprite_attribute_table_address_ =
           this->sprite_attribute_table_address_;
      break;
    case 6:
      install_field<11,8>(this,&this->sprite_generator_table_address_,value);
      (this->super_Storage<(TI::TMS::Personality)3,_void>).sprite_generator_table_address_ =
           this->sprite_generator_table_address_;
      break;
    case 7:
      this->text_colour_ = value >> 4;
      this->background_colour_ = value & 0xf;
      break;
    case 8:
      (this->super_Storage<(TI::TMS::Personality)3,_void>).horizontal_scroll_ = value;
      break;
    case 9:
      (this->super_Storage<(TI::TMS::Personality)3,_void>).vertical_scroll_ = value;
      break;
    case 10:
      this->line_interrupt_target_ = value;
    }
  }
  else {
    (this->super_Storage<(TI::TMS::Personality)3,_void>).cram_is_selected_ = true;
  }
  return;
}

Assistant:

void Base<personality>::commit_register(int reg, uint8_t value) {
	if constexpr (is_yamaha_vdp(personality)) {
		reg &= 0x3f;
	} else if constexpr (is_sega_vdp(personality)) {
		if(reg & 0x40) {
			Storage<personality>::cram_is_selected_ = true;
			return;
		}
		reg &= 0xf;
	} else {
		reg &= 0x7;
	}

	//
	// Generic TMS functionality.
	//
	switch(reg) {
		case 0:
			mode2_enable_ = value & 0x02;
		break;

		case 1:
			blank_display_ = !(value & 0x40);
			generate_interrupts_ = value & 0x20;
			mode1_enable_ = value & 0x10;
			mode3_enable_ = value & 0x08;
			sprites_16x16_ = value & 0x02;
			sprites_magnified_ = value & 0x01;

			sprite_height_ = 8;
			if(sprites_16x16_) sprite_height_ <<= 1;
			if(sprites_magnified_) sprite_height_ <<= 1;
		break;

		case 2:	install_field<10>(pattern_name_address_, value);			break;
		case 3:	install_field<6>(colour_table_address_, value);				break;
		case 4: install_field<11>(pattern_generator_table_address_, value);	break;
		case 5:	install_field<7>(sprite_attribute_table_address_, value);	break;
		case 6:	install_field<11>(sprite_generator_table_address_, value);	break;

		case 7:
			text_colour_ = value >> 4;
			background_colour_ = value & 0xf;
		break;

		default: break;
	}

	//
	// Sega extensions.
	//
	if constexpr (is_sega_vdp(personality)) {
		switch(reg) {
			default: break;

			case 0:
				Storage<personality>::vertical_scroll_lock_ = value & 0x80;
				Storage<personality>::horizontal_scroll_lock_ = value & 0x40;
				Storage<personality>::hide_left_column_ = value & 0x20;
				enable_line_interrupts_ = value & 0x10;
				Storage<personality>::shift_sprites_8px_left_ = value & 0x08;
				Storage<personality>::mode4_enable_ = value & 0x04;
			break;

			case 2:
				Storage<personality>::pattern_name_address_ = pattern_name_address_ | ((personality == TMS::SMSVDP) ? 0x000 : 0x400);
			break;

			case 5:
				Storage<personality>::sprite_attribute_table_address_ = sprite_attribute_table_address_ | ((personality == TMS::SMSVDP) ? 0x00 : 0x80);
			break;

			case 6:
				Storage<personality>::sprite_generator_table_address_ = sprite_generator_table_address_ | ((personality == TMS::SMSVDP) ? 0x0000 : 0x1800);
			break;

			case 8:
				Storage<personality>::horizontal_scroll_ = value;
			break;

			case 9:
				Storage<personality>::vertical_scroll_ = value;
			break;

			case 10:
				line_interrupt_target_ = value;
			break;
		}
	}

	//
	// Yamaha extensions.
	//
	if constexpr (is_yamaha_vdp(personality)) {
		switch(reg) {
			default: break;

			case 0:
				Storage<personality>::mode_ = uint8_t(
					(Storage<personality>::mode_ & 3) |
					((value & 0xe) << 1)
				);
				enable_line_interrupts_ = value & 0x10;

				// b1–b3: M3–M5
				// b4: enable horizontal retrace interrupt
				// b5: enable light pen interrupts
				// b6: set colour bus to input or output mode
			break;

			case 1:
				Storage<personality>::mode_ = uint8_t(
					(Storage<personality>::mode_ & 0x1c) |
					((value & 0x10) >> 4) |
					((value & 0x08) >> 2)
				);
			break;

			case 7:
				Storage<personality>::background_palette_[0] = Storage<personality>::palette_[background_colour_];
			break;

			case 8:
				Storage<personality>::solid_background_ = value & 0x20;
				Storage<personality>::sprites_enabled_ = !(value & 0x02);
				if(value & 0x01) {
					logger.error().append("TODO: Yamaha greyscale");
				}
				// b7: "1 = input on colour bus, enable mouse; 1 = output on colour bus, disable mouse" [documentation clearly in error]
				// b6: 1 = enable light pen
				// b5: sets the colour of code 0 to the colour of the palette (???)
				// b4: 1 = colour bus in input mode; 0 = colour bus in output mode
				// b3: 1 = VRAM is 64kx1 or 64kx4; 0 = 16kx1 or 16kx4; affects refresh.
				// b1: 1 = disable sprites (and release sprite access slots)
				// b0: 1 = output in grayscale
			break;

			case 9:
				mode_timing_.pixel_lines = (value & 0x80) ? 212 : 192;
				mode_timing_.end_of_frame_interrupt_position.row = mode_timing_.pixel_lines+1;
				// TODO: on the Yamaha, at least, tie this interrupt overtly to vertical state.

				if(value & 0x08) {
					logger.error().append("TODO: Yamaha interlace mode");
				}

				// b7: 1 = 212 lines of pixels; 0 = 192
				// b5 & b4: select simultaneous mode (seems to relate to line length and in-phase colour?)
				// b3: 1 = interlace on
				// b2: 1 = display two graphic screens interchangeably by even/odd field
				// b1: 1 = PAL mode; 0 = NTSC mode
				// b0: 1 = [dot clock] DLCLK is input; 0 = DLCLK is output
			break;

			// b0–b2: A14–A16 of the colour table.
			case 10:	install_field<14>(colour_table_address_, value);			break;

			// b0–b1: A15–A16 of the sprite table.
			case 11:	install_field<15>(sprite_attribute_table_address_, value);	break;

			case 12:
				Storage<personality>::blink_text_colour_ = value >> 4;
				Storage<personality>::blink_background_colour_ = value & 0xf;
				// as per register 7, but in blink mode.
			break;

			case 13:
				Storage<personality>::blink_periods_ = value;
				if(!value) {
					Storage<personality>::in_blink_ = 0;
				}

				// b0–b3: display time for odd page;
				// b4–b7: display time for even page.
			break;

			case 14:	install_field<14>(ram_pointer_, value);						break;

			case 15:
				Storage<personality>::selected_status_ = value & 0xf;
			break;

			case 16:
				Storage<personality>::palette_entry_ = value;
				// b0–b3: palette entry for writing on port 2; autoincrements upon every write.
			break;

			case 17:
				Storage<personality>::increment_indirect_register_ = !(value & 0x80);
				Storage<personality>::indirect_register_ = value & 0x3f;
			break;

			case 18:
				Storage<personality>::adjustment_[0] = (8 - ((value & 15) ^ 8)) * 4;
				Storage<personality>::adjustment_[1] = 8 - ((value >> 4) ^ 8);
				// b0-b3: horizontal adjustment
				// b4-b7: vertical adjustment
			break;

			case 19:
				line_interrupt_target_ = value;
				// b0–b7: line to match for interrupts (if eabled)
			break;

			case 20:
			case 21:
			case 22:
//				logger.error().append("TODO: Yamaha colour burst selection; %02x", value);
				// Documentation is "fill with 0s for no colour burst; magic pattern for colour burst"
			break;

			case 23:
				Storage<personality>::vertical_offset_ = value;
			break;

			case 32:	Storage<personality>::command_context_.source.template set<0, false>(value);		break;
			case 33:	Storage<personality>::command_context_.source.template set<0, true>(value);			break;
			case 34:	Storage<personality>::command_context_.source.template set<1, false>(value);		break;
			case 35:	Storage<personality>::command_context_.source.template set<1, true>(value);			break;

			case 36:	Storage<personality>::command_context_.destination.template set<0, false>(value);	break;
			case 37:	Storage<personality>::command_context_.destination.template set<0, true>(value);	break;
			case 38:	Storage<personality>::command_context_.destination.template set<1, false>(value);	break;
			case 39:	Storage<personality>::command_context_.destination.template set<1, true>(value);	break;

			case 40:	Storage<personality>::command_context_.size.template set<0, false>(value);			break;
			case 41:	Storage<personality>::command_context_.size.template set<0, true>(value);			break;
			case 42:	Storage<personality>::command_context_.size.template set<1, false>(value);			break;
			case 43:	Storage<personality>::command_context_.size.template set<1, true>(value);			break;

			case 44:
				Storage<personality>::command_context_.colour.set(value);

				// Check whether a command was blocked on this.
				if(
					Storage<personality>::command_ &&
					Storage<personality>::command_->access == Command::AccessType::WaitForColourReceipt
				) {
					Storage<personality>::command_->advance();
					Storage<personality>::update_command_step(fetch_pointer_.column);
				}
			break;

			case 45:
				Storage<personality>::command_context_.arguments = value;
				// b6: MXC, i.e. destination for INed/OUTed video data; 0 = video RAM; 1 = expansion RAM.
				// b5: MXD, destination for command engine.
				// b4: MXS, source for command engine.
				// b3: DIY
				// b2: DIX
				// b1: EQ
				// b0: MAJ
			break;

			case 46:
				// b0–b3: LO0–LO3 (i.e. operation to apply if this is a logical command)
				// b4–b7: CM0-CM3 (i.e. command to perform)

				// If a command is already ongoing and this is not a stop, ignore it.
				if(Storage<personality>::command_ && (value >> 4) != 0b0000) {
					break;
				}

#define Begin(x)	Storage<personality>::command_ = std::make_unique<Commands::x>(Storage<personality>::command_context_, Storage<personality>::mode_description_);
				using MoveType = Commands::MoveType;
				switch(value >> 4) {
					// All codes not listed below are invalid; treat them as STOP.
					default:
					case 0b0000:	Storage<personality>::command_ = nullptr;	break;	// STOP.

					case 0b0100:	Begin(Point<true>);							break;	// POINT [read a pixel colour].
					case 0b0101:	Begin(Point<false>);						break;	// PSET [plot a pixel].
					case 0b0110:	break;	// TODO: srch.	[search horizontally for a colour]
					case 0b0111:	Begin(Line);								break;	// LINE [draw a Bresenham line].

					case 0b1000:	Begin(Fill<true>);							break;	// LMMV [logical move, VDP to VRAM, i.e. solid-colour fill].
					case 0b1001:	Begin(Move<MoveType::Logical>);				break;	// LMMM [logical move, VRAM to VRAM].
					case 0b1010:	break;	// TODO: lmcm.	[logical move, VRAM to CPU]
					case 0b1011:	Begin(MoveFromCPU<true>);					break;	// LMMC [logical move, CPU to VRAM].

					case 0b1100:	Begin(Fill<false>);							break;	// HMMV [high-speed move, VDP to VRAM, i.e. single-byte fill].
					case 0b1101:	Begin(Move<MoveType::HighSpeed>);			break;	// HMMM [high-speed move, VRAM to VRAM].
					case 0b1110:	Begin(Move<MoveType::YOnly>);				break;	// YMMM [high-speed move, y only, VRAM to VRAM].
					case 0b1111:	Begin(MoveFromCPU<false>);					break;	// HMMC [high-speed move, CPU to VRAM].
				}
#undef Begin

				Storage<personality>::command_context_.pixel_operation = CommandContext::LogicalOperation(value & 7);
				Storage<personality>::command_context_.test_source = value & 8;

				// Kill the command immediately if it's done in zero operations
				// (e.g. a line of length 0).
				if(!Storage<personality>::command_ && (value >> 4)) {
					logger.error().append("TODO: Yamaha command %02x", value);
				}

				// Seed timing information if a command was found.
				Storage<personality>::update_command_step(fetch_pointer_.column);
			break;
		}
	}
}